

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O3

void elt_mul(u8 *d,u8 *a,u8 *b)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  u32 i;
  byte bVar6;
  bool bVar7;
  
  d[0xe] = '\0';
  d[0xf] = '\0';
  d[0x10] = '\0';
  d[0x11] = '\0';
  d[0x12] = '\0';
  d[0x13] = '\0';
  d[0x14] = '\0';
  d[0x15] = '\0';
  d[0x16] = '\0';
  d[0x17] = '\0';
  d[0x18] = '\0';
  d[0x19] = '\0';
  d[0x1a] = '\0';
  d[0x1b] = '\0';
  d[0x1c] = '\0';
  d[0x1d] = '\0';
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  d[4] = '\0';
  d[5] = '\0';
  d[6] = '\0';
  d[7] = '\0';
  d[8] = '\0';
  d[9] = '\0';
  d[10] = '\0';
  d[0xb] = '\0';
  d[0xc] = '\0';
  d[0xd] = '\0';
  d[0xe] = '\0';
  d[0xf] = '\0';
  iVar2 = 0;
  uVar3 = 1;
  uVar5 = 0;
  do {
    bVar1 = *d;
    lVar4 = 1;
    bVar6 = 0;
    do {
      d[lVar4 + -1] = d[lVar4] >> 7 | bVar6;
      bVar6 = d[lVar4] * '\x02';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1e);
    d[0x1d] = bVar6 | bVar1 & 1;
    d[0x14] = d[0x14] ^ (bVar1 & 1) << 2;
    if ((uVar3 & a[uVar5]) != 0) {
      lVar4 = 0;
      do {
        d[lVar4] = d[lVar4] ^ b[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1e);
    }
    uVar3 = uVar3 >> 1;
    bVar7 = uVar3 == 0;
    if (bVar7) {
      uVar3 = 0x80;
    }
    uVar5 = uVar5 + bVar7;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xe9);
  return;
}

Assistant:

static void elt_mul(u8 *d, u8 *a, u8 *b)
{
	u32 i, n;
	u8 mask;

	elt_zero(d);

	i = 0;
	mask = 1;
	for (n = 0; n < 233; n++) {
		elt_mul_x(d, d);

		if ((a[i] & mask) != 0)
			elt_add(d, d, b);

		mask >>= 1;
		if (mask == 0) {
			mask = 0x80;
			i++;
		}
	}
}